

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O2

void __thiscall ItemTable::GreenRoomOne(ItemTable *this)

{
  ItemWrapper *this_00;
  ItemWrapper *this_01;
  ItemWrapper *pIVar1;
  ItemWrapper *pIVar2;
  mapped_type *ppIVar3;
  key_type local_1f4;
  ItemWrapper *local_1f0;
  ItemWrapper *local_1e8;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  Item local_120;
  Item local_f8;
  Item local_d0;
  Item local_a8;
  Item local_80;
  Item local_58;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_140,"Fox Token",(allocator *)&local_1f4);
  Item::Item(&local_58,&local_140,FOX_TOKEN);
  ItemWrapper::ItemWrapper(this_00,&local_58,G_ROOM1_SIDE1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_140);
  this_01 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_160,"Bean Token",(allocator *)&local_1f4);
  Item::Item(&local_80,&local_160,BEAN_TOKEN);
  ItemWrapper::ItemWrapper(this_01,&local_80,G_ROOM1_SIDE1);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_160);
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_180,"Goose Token",(allocator *)&local_1f4);
  Item::Item(&local_a8,&local_180,GOOSE_TOKEN);
  ItemWrapper::ItemWrapper(pIVar1,&local_a8,G_ROOM1_SIDE1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_180);
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_1a0,"Token Door",(allocator *)&local_1f4);
  local_1f0 = pIVar2;
  Item::Item(&local_d0,&local_1a0,TOKEN_DOOR);
  local_1e8 = pIVar1;
  ItemWrapper::ItemWrapper(pIVar2,&local_d0,HIDDEN);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1a0);
  pIVar1 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_1c0,"GreenRoomOne",(allocator *)&local_1f4);
  Item::Item(&local_f8,&local_1c0,G_ROOM_STATE);
  ItemWrapper::ItemWrapper(pIVar1,&local_f8,NOT_WON);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_1c0);
  pIVar2 = (ItemWrapper *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_1e0,"old Boat",(allocator *)&local_1f4);
  Item::Item(&local_120,&local_1e0,G_BOAT);
  ItemWrapper::ItemWrapper(pIVar2,&local_120,G_ROOM1_SIDE1);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_1e0);
  local_1f4 = FOX_TOKEN;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1f4);
  *ppIVar3 = this_00;
  local_1f4 = BEAN_TOKEN;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1f4);
  *ppIVar3 = this_01;
  local_1f4 = GOOSE_TOKEN;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1f4);
  *ppIVar3 = local_1e8;
  local_1f4 = TOKEN_DOOR;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1f4);
  *ppIVar3 = local_1f0;
  local_1f4 = G_ROOM_STATE;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1f4);
  *ppIVar3 = pIVar1;
  local_1f4 = G_BOAT;
  ppIVar3 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_1f4);
  *ppIVar3 = pIVar2;
  return;
}

Assistant:

void ItemTable::GreenRoomOne(){

    ItemWrapper *       foxToken = new ItemWrapper(Item("Fox Token", FOX_TOKEN), G_ROOM1_SIDE1);
    ItemWrapper *      beanToken = new ItemWrapper(Item("Bean Token", BEAN_TOKEN), G_ROOM1_SIDE1);
    ItemWrapper *     gooseToken = new ItemWrapper(Item("Goose Token", GOOSE_TOKEN), G_ROOM1_SIDE1);
    ItemWrapper * gRoomTokenDoor = new ItemWrapper(Item("Token Door", TOKEN_DOOR), HIDDEN);
    ItemWrapper * gRoomOne       = new ItemWrapper(Item("GreenRoomOne", G_ROOM_STATE), NOT_WON);
    ItemWrapper * boat = new ItemWrapper(Item("old Boat", G_BOAT), G_ROOM1_SIDE1);

    items[FOX_TOKEN]   = foxToken;
    items[BEAN_TOKEN]  = beanToken;
    items[GOOSE_TOKEN] = gooseToken;
    items[TOKEN_DOOR]  = gRoomTokenDoor;
    items[G_ROOM_STATE] = gRoomOne;
    items[G_BOAT] = boat;
}